

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGB1555ToYRow_C(uint8_t *src_argb1555,uint8_t *dst_y,int width)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  if (0 < width) {
    lVar1 = 0;
    do {
      bVar2 = src_argb1555[lVar1 * 2];
      bVar3 = src_argb1555[lVar1 * 2 + 1];
      bVar4 = bVar3 * '\b' | bVar2 >> 5;
      bVar2 = bVar2 >> 2 & 7 | bVar2 * '\b';
      bVar3 = bVar3 >> 4 & 7 | bVar3 * '\x02' & 0xf8;
      dst_y[lVar1] = (uint8_t)(((uint)bVar2 + (uint)bVar2 * 4) * 5 +
                               (uint)bVar3 * 0x40 + (uint)bVar3 * 2 +
                               (uint)(byte)((bVar4 & 0x1c) >> 2 | bVar4 << 3) * 0x81 + 0x1080 >> 8);
      lVar1 = lVar1 + 1;
    } while (width != (int)lVar1);
  }
  return;
}

Assistant:

void ARGB1555ToYRow_C(const uint8_t* src_argb1555, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb1555[0] & 0x1f;
    uint8_t g = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r = (src_argb1555[1] & 0x7c) >> 2;
    b = (b << 3) | (b >> 2);
    g = (g << 3) | (g >> 2);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_argb1555 += 2;
    dst_y += 1;
  }
}